

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O2

path * GetOutputFileName_abi_cxx11_(path *__return_storage_ptr__,char **p)

{
  path local_60;
  delim_string_t str_name;
  
  GetDelimitedStringEx_abi_cxx11_(&str_name,p);
  SJ_FixSlashes(&str_name,true);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_60,&str_name.first,auto_format);
  std::filesystem::__cxx11::operator/
            (__return_storage_ptr__,(path *)Options::OutPrefix_abi_cxx11_,&local_60);
  std::filesystem::__cxx11::path::~path(&local_60);
  std::__cxx11::string::~string((string *)&str_name);
  return __return_storage_ptr__;
}

Assistant:

std::filesystem::path GetOutputFileName(char*& p) {
	auto str_name = GetDelimitedStringEx(p);	// read delimited filename string
	SJ_FixSlashes(str_name);					// convert backslashes *with* warning
	// prefix with output path and force slashes again (without warning)
	return SJ_force_slash(Options::OutPrefix / str_name.first);
}